

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O2

void vera::computeSmoothingNormals
               (attrib_t *_attrib,shape_t *_shape,
               map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
               *smoothVertexNormals)

{
  _Rb_tree_header *p_Var1;
  pointer paVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Self __tmp;
  ulong uVar6;
  size_t i;
  long lVar7;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar8;
  vec3 vVar9;
  vec<3,_float,_(glm::qualifier)0> vVar10;
  int vi [3];
  vec3 normal;
  vec3 v [3];
  
  std::
  _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  ::clear(&smoothVertexNormals->_M_t);
  p_Var1 = &(smoothVertexNormals->_M_t)._M_impl.super__Rb_tree_header;
  uVar6 = 0;
  while( true ) {
    paVar2 = (_shape->mesh).indices.
             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(_shape->mesh).indices.
                       super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar2) / 0xc) / 3 <= uVar6
       ) break;
    vi[0] = paVar2[uVar6 * 3].vertex_index;
    vi[1] = paVar2[uVar6 * 3 + 1].vertex_index;
    vi[2] = paVar2[uVar6 * 3 + 2].vertex_index;
    paVar8 = &v[0].field_2;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      vVar9 = getVertex(_attrib,vi[lVar7]);
      ((vec3 *)(paVar8 + -2))->field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar9._0_8_;
      ((vec3 *)(paVar8 + -2))->field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)vVar9._0_8_ >> 0x20);
      *paVar8 = vVar9.field_2;
      paVar8 = paVar8 + 3;
    }
    calcNormal(v,v + 1,v + 2,&normal);
    for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
      iVar3 = std::
              _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
              ::find(&smoothVertexNormals->_M_t,(key_type_conflict *)((long)vi + lVar7));
      if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
        pmVar4 = std::
                 map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                 ::operator[](smoothVertexNormals,(key_type_conflict *)((long)vi + lVar7));
        pmVar4->field_0 = normal.field_0;
        pmVar4->field_1 = normal.field_1;
        pmVar4->field_2 = normal.field_2;
      }
      else {
        glm::vec<3,float,(glm::qualifier)0>::operator+=
                  ((vec<3,float,(glm::qualifier)0> *)&iVar3._M_node[1].field_0x4,&normal);
      }
    }
    uVar6 = uVar6 + 1;
  }
  for (p_Var5 = (smoothVertexNormals->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    vVar10 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                       ((vec<3,_float,_(glm::qualifier)0> *)&p_Var5[1].field_0x4);
    *(vec<3,_float,_(glm::qualifier)0> *)&p_Var5[1].field_0x4 = vVar10;
  }
  return;
}

Assistant:

void computeSmoothingNormals(const tinyobj::attrib_t& _attrib, const tinyobj::shape_t& _shape, std::map<int, glm::vec3>& smoothVertexNormals) {
    smoothVertexNormals.clear();

    std::map<int, glm::vec3>::iterator iter;

    for (size_t f = 0; f < _shape.mesh.indices.size() / 3; f++) {
        // Get the three indexes of the face (all faces are triangular)
        tinyobj::index_t idx0 = _shape.mesh.indices[3 * f + 0];
        tinyobj::index_t idx1 = _shape.mesh.indices[3 * f + 1];
        tinyobj::index_t idx2 = _shape.mesh.indices[3 * f + 2];

        // Get the three vertex indexes and coordinates
        int vi[3];      // indexes
        vi[0] = idx0.vertex_index;
        vi[1] = idx1.vertex_index;
        vi[2] = idx2.vertex_index;

        glm::vec3 v[3];  // coordinates
        for (size_t i = 0; i < 3; i++)
            v[i] = getVertex(_attrib, vi[i]);

        // Compute the normal of the face
        glm::vec3 normal;
        calcNormal(v[0], v[1], v[2], normal);

        // Add the normal to the three vertexes
        for (size_t i = 0; i < 3; ++i) {
            iter = smoothVertexNormals.find(vi[i]);
            // add
            if (iter != smoothVertexNormals.end())
                iter->second += normal;
            else
                smoothVertexNormals[vi[i]] = normal;
        }
    }  // f

    // Normalize the normals, that is, make them unit vectors
    for (iter = smoothVertexNormals.begin(); iter != smoothVertexNormals.end(); iter++) {
        iter->second = glm::normalize(iter->second);
    }
}